

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mytools.cpp
# Opt level: O1

bool isBigEndian(void)

{
  return false;
}

Assistant:

bool isBigEndian()
{
    uint16_t a = 0x1234;
    uint8_t  b = *(uint8_t *)&a;
    if(b == 0x12) {
        return true;
    }else {
        return false;
    }
}